

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int Hsh_VecManAdd(Hsh_VecMan_t *p,Vec_Int_t *vVec)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vVec_00;
  int *piVar5;
  Hsh_VecObj_t *pHVar6;
  int *local_38;
  int *pPlace;
  int Ent;
  int i;
  Hsh_VecObj_t *pObj;
  Vec_Int_t *vVec_local;
  Hsh_VecMan_t *p_local;
  
  iVar2 = Vec_IntSize(p->vMap);
  iVar3 = Vec_IntSize(p->vTable);
  if (iVar3 < iVar2) {
    pVVar1 = p->vTable;
    iVar2 = Vec_IntSize(p->vTable);
    iVar2 = Abc_PrimeCudd(iVar2 << 1);
    Vec_IntFill(pVVar1,iVar2,-1);
    for (pPlace._4_4_ = 0; iVar2 = Vec_IntSize(p->vMap), pPlace._4_4_ < iVar2;
        pPlace._4_4_ = pPlace._4_4_ + 1) {
      pVVar1 = p->vTable;
      vVec_00 = Hsh_VecReadEntry(p,pPlace._4_4_);
      iVar2 = Vec_IntSize(p->vTable);
      iVar2 = Hsh_VecManHash(vVec_00,iVar2);
      piVar5 = Vec_IntEntryP(pVVar1,iVar2);
      iVar2 = *piVar5;
      pHVar6 = Hsh_VecObj(p,pPlace._4_4_);
      pHVar6->iNext = iVar2;
      *piVar5 = pPlace._4_4_;
    }
  }
  pVVar1 = p->vTable;
  iVar2 = Vec_IntSize(p->vTable);
  iVar2 = Hsh_VecManHash(vVec,iVar2);
  local_38 = Vec_IntEntryP(pVVar1,iVar2);
  do {
    pHVar6 = Hsh_VecObj(p,*local_38);
    if (pHVar6 == (Hsh_VecObj_t *)0x0) {
      iVar2 = Vec_IntSize(p->vMap);
      *local_38 = iVar2;
      iVar2 = Vec_IntSize(p->vData);
      if (iVar2 % 2 == 0) {
        pVVar1 = p->vMap;
        iVar2 = Vec_IntSize(p->vData);
        Vec_IntPush(pVVar1,iVar2);
        pVVar1 = p->vData;
        iVar2 = Vec_IntSize(vVec);
        Vec_IntPush(pVVar1,iVar2);
        Vec_IntPush(p->vData,-1);
        for (pPlace._4_4_ = 0; iVar2 = Vec_IntSize(vVec), pPlace._4_4_ < iVar2;
            pPlace._4_4_ = pPlace._4_4_ + 1) {
          iVar2 = Vec_IntEntry(vVec,pPlace._4_4_);
          Vec_IntPush(p->vData,iVar2);
        }
        uVar4 = Vec_IntSize(vVec);
        if ((uVar4 & 1) != 0) {
          Vec_IntPush(p->vData,-1);
        }
        iVar2 = Vec_IntSize(p->vMap);
        return iVar2 + -1;
      }
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecHsh.h"
                    ,0x17a,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    iVar2 = pHVar6->nSize;
    iVar3 = Vec_IntSize(vVec);
    if (iVar2 == iVar3) {
      piVar5 = Vec_IntArray(vVec);
      iVar2 = memcmp(pHVar6 + 1,piVar5,(long)pHVar6->nSize << 2);
      if (iVar2 == 0) {
        return *local_38;
      }
    }
    local_38 = &pHVar6->iNext;
  } while( true );
}

Assistant:

static inline int Hsh_VecManAdd( Hsh_VecMan_t * p, Vec_Int_t * vVec )
{
    Hsh_VecObj_t * pObj;
    int i, Ent, * pPlace;
    if ( Vec_IntSize(p->vMap) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_IntSize(p->vMap); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(Hsh_VecReadEntry(p, i), Vec_IntSize(p->vTable)) );
            Hsh_VecObj(p, i)->iNext = *pPlace; *pPlace = i;
        }
    }
    pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(vVec, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_VecObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->nSize == Vec_IntSize(vVec) && !memcmp( pObj->pArray, Vec_IntArray(vVec), sizeof(int) * pObj->nSize ) )
            return *pPlace;
    *pPlace = Vec_IntSize(p->vMap);
    assert( Vec_IntSize(p->vData) % 2 == 0 );
    Vec_IntPush( p->vMap, Vec_IntSize(p->vData) );
    Vec_IntPush( p->vData, Vec_IntSize(vVec) );
    Vec_IntPush( p->vData, -1 );
    Vec_IntForEachEntry( vVec, Ent, i )
        Vec_IntPush( p->vData, Ent );
    if ( Vec_IntSize(vVec) & 1 )
        Vec_IntPush( p->vData, -1 );
    return Vec_IntSize(p->vMap) - 1;
}